

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::smul_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  bool bVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  APInt AVar3;
  bool local_71;
  APInt local_50;
  APInt local_40;
  undefined1 local_29;
  undefined1 *local_28;
  bool *Overflow_local;
  APInt *RHS_local;
  APInt *this_local;
  APInt *Res;
  
  local_28 = (undefined1 *)CONCAT71(in_register_00000009,in_CL);
  local_29 = 0;
  Overflow_local = Overflow;
  RHS_local = RHS;
  this_local = this;
  operator*(this,RHS);
  bVar1 = operator!=(RHS,0);
  uVar2 = extraout_RDX;
  if ((bVar1) && (bVar1 = operator!=((APInt *)Overflow_local,0), uVar2 = extraout_RDX_00, bVar1)) {
    sdiv(&local_40,this);
    bVar1 = operator!=(&local_40,RHS);
    local_71 = true;
    if (!bVar1) {
      sdiv(&local_50,this);
      local_71 = operator!=(&local_50,(APInt *)Overflow_local);
    }
    *local_28 = local_71;
    if (!bVar1) {
      ~APInt(&local_50);
    }
    ~APInt(&local_40);
    uVar2 = extraout_RDX_01;
  }
  else {
    *local_28 = 0;
  }
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt APInt::smul_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this * RHS;

  if (*this != 0 && RHS != 0)
    Overflow = Res.sdiv(RHS) != *this || Res.sdiv(*this) != RHS;
  else
    Overflow = false;
  return Res;
}